

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int check_sbit(spng_sbit *sbit,spng_ihdr *ihdr)

{
  byte bVar1;
  
  if (ihdr == (spng_ihdr *)0x0 || sbit == (spng_sbit *)0x0) {
    return 1;
  }
  switch(ihdr->color_type) {
  case '\0':
    if (sbit->grayscale_bits == 0) {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->grayscale_bits) {
      return 0x29;
    }
    break;
  case '\x02':
  case '\x03':
    if (sbit->red_bits == 0) {
      return 0x29;
    }
    if (sbit->green_bits == 0) {
      return 0x29;
    }
    if (sbit->blue_bits == 0) {
      return 0x29;
    }
    bVar1 = 8;
    if (ihdr->color_type != '\x03') {
      bVar1 = ihdr->bit_depth;
    }
    if (bVar1 < sbit->blue_bits) {
      return 0x29;
    }
    if (bVar1 < sbit->red_bits) {
      return 0x29;
    }
    if (bVar1 < sbit->green_bits) {
      return 0x29;
    }
    return 0;
  case '\x04':
    if (sbit->grayscale_bits == 0) {
      return 0x29;
    }
    if (sbit->alpha_bits == 0) {
      return 0x29;
    }
    if (ihdr->bit_depth < sbit->alpha_bits || ihdr->bit_depth < sbit->grayscale_bits) {
      return 0x29;
    }
    break;
  case '\x06':
    if (sbit->red_bits == 0) {
      return 0x29;
    }
    if (sbit->green_bits == 0) {
      return 0x29;
    }
    if (sbit->blue_bits == 0) {
      return 0x29;
    }
    if (sbit->alpha_bits == 0) {
      return 0x29;
    }
    bVar1 = ihdr->bit_depth;
    if (bVar1 < sbit->alpha_bits) {
      return 0x29;
    }
    if (bVar1 < sbit->blue_bits) {
      return 0x29;
    }
    if (bVar1 < sbit->red_bits) {
      return 0x29;
    }
    if (bVar1 < sbit->green_bits) {
      return 0x29;
    }
  }
  return 0;
}

Assistant:

static int check_sbit(const struct spng_sbit *sbit, const struct spng_ihdr *ihdr)
{
    if(sbit == NULL || ihdr == NULL) return 1;

    if(ihdr->color_type == 0)
    {
        if(sbit->grayscale_bits == 0) return SPNG_ESBIT;
        if(sbit->grayscale_bits > ihdr->bit_depth) return SPNG_ESBIT;
    }
    else if(ihdr->color_type == 2 || ihdr->color_type == 3)
    {
        if(sbit->red_bits == 0) return SPNG_ESBIT;
        if(sbit->green_bits == 0) return SPNG_ESBIT;
        if(sbit->blue_bits == 0) return SPNG_ESBIT;

        uint8_t bit_depth;
        if(ihdr->color_type == 3) bit_depth = 8;
        else bit_depth = ihdr->bit_depth;

        if(sbit->red_bits > bit_depth) return SPNG_ESBIT;
        if(sbit->green_bits > bit_depth) return SPNG_ESBIT;
        if(sbit->blue_bits > bit_depth) return SPNG_ESBIT;
    }
    else if(ihdr->color_type == 4)
    {
        if(sbit->grayscale_bits == 0) return SPNG_ESBIT;
        if(sbit->alpha_bits == 0) return SPNG_ESBIT;

        if(sbit->grayscale_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->alpha_bits > ihdr->bit_depth) return SPNG_ESBIT;
    }
    else if(ihdr->color_type == 6)
    {
        if(sbit->red_bits == 0) return SPNG_ESBIT;
        if(sbit->green_bits == 0) return SPNG_ESBIT;
        if(sbit->blue_bits == 0) return SPNG_ESBIT;
        if(sbit->alpha_bits == 0) return SPNG_ESBIT;

        if(sbit->red_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->green_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->blue_bits > ihdr->bit_depth) return SPNG_ESBIT;
        if(sbit->alpha_bits > ihdr->bit_depth) return SPNG_ESBIT;
    }

    return 0;
}